

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O3

void __thiscall ctemplate::TemplateCache::Freeze(TemplateCache *this)

{
  bool bVar1;
  int iVar2;
  ReaderMutexLock ml;
  ReaderMutexLock local_18;
  
  local_18.mu_ = this->mutex_;
  if (((pthread_rwlock_t *)((long)local_18.mu_ + 0x38))->__size[0] == '\x01') {
    iVar2 = pthread_rwlock_rdlock((pthread_rwlock_t *)local_18.mu_);
    if (iVar2 != 0) goto LAB_00122199;
  }
  bVar1 = this->is_frozen_;
  ReaderMutexLock::~ReaderMutexLock(&local_18);
  if (bVar1 == false) {
    ReloadAllIfChanged(this,IMMEDIATE_RELOAD);
    local_18.mu_ = this->mutex_;
    if (((pthread_rwlock_t *)((long)local_18.mu_ + 0x38))->__size[0] == '\x01') {
      iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_18.mu_);
      if (iVar2 != 0) {
LAB_00122199:
        abort();
      }
    }
    this->is_frozen_ = true;
    WriterMutexLock::~WriterMutexLock((WriterMutexLock *)&local_18);
  }
  return;
}

Assistant:

void TemplateCache::Freeze() {
  {
    ReaderMutexLock ml(mutex_);
    if (is_frozen_) {  // if already frozen, then this is a no-op.
      return;
    }
  }
  // A final reload before freezing the cache.
  ReloadAllIfChanged(IMMEDIATE_RELOAD);
  {
    WriterMutexLock ml(mutex_);
    is_frozen_ = true;
  }
}